

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas-calc.c
# Opt level: O0

int32_t calculate_value_from_formula_depth(borg_array *f,int *i,int pdepth,int range_index)

{
  int iVar1;
  int *piVar2;
  undefined4 *puVar3;
  void **ppvVar4;
  bool local_6a;
  bool local_69;
  token *next_token;
  int32_t total;
  token *right_token;
  int32_t right_value;
  token *operation;
  int32_t left_value;
  token *left_token;
  int range_index_local;
  int pdepth_local;
  int *i_local;
  borg_array *f_local;
  
  piVar2 = (int *)f->items[*i];
  operation._4_4_ = 0;
  if (pdepth < piVar2[4]) {
    operation._4_4_ = calculate_value_from_formula_depth(f,i,pdepth + 1,range_index);
  }
  else if (*piVar2 == 2) {
    operation._4_4_ = **(uint **)(piVar2 + 2);
    if ((*(byte *)(piVar2 + 1) & 1) != 0) {
      operation._4_4_ = (uint)((operation._4_4_ != 0 ^ 0xffU) & 1);
    }
  }
  else if ((*piVar2 == 1) &&
          (operation._4_4_ = calculate_from_value(*(value_sec **)(piVar2 + 2),range_index),
          (*(byte *)(piVar2 + 1) & 1) != 0)) {
    operation._4_4_ = (uint)((operation._4_4_ != 0 ^ 0xffU) & 1);
  }
  if (*i + 1 < f->count) {
    puVar3 = (undefined4 *)f->items[*i + 1];
    if ((int)puVar3[4] < pdepth) {
      f_local._4_4_ = operation._4_4_;
    }
    else {
      *i = *i + 1;
      right_token._4_4_ = 0;
      ppvVar4 = f->items;
      iVar1 = *i;
      *i = iVar1 + 1;
      piVar2 = (int *)ppvVar4[iVar1 + 1];
      if (pdepth < piVar2[4]) {
        right_token._4_4_ = calculate_value_from_formula_depth(f,i,pdepth + 1,range_index);
      }
      else if (*piVar2 == 2) {
        right_token._4_4_ = **(uint **)(piVar2 + 2);
        if ((*(byte *)(piVar2 + 1) & 1) != 0) {
          right_token._4_4_ = (uint)((right_token._4_4_ != 0 ^ 0xffU) & 1);
        }
      }
      else if ((*piVar2 == 1) &&
              (right_token._4_4_ = calculate_from_value(*(value_sec **)(piVar2 + 2),range_index),
              (*(byte *)(piVar2 + 1) & 1) != 0)) {
        right_token._4_4_ = (uint)((right_token._4_4_ != 0 ^ 0xffU) & 1);
      }
      next_token._4_4_ = 0;
      switch(*puVar3) {
      case 3:
        next_token._4_4_ = operation._4_4_ - right_token._4_4_;
        break;
      case 4:
        next_token._4_4_ = operation._4_4_ + right_token._4_4_;
        break;
      case 5:
        next_token._4_4_ = operation._4_4_ * right_token._4_4_;
        break;
      case 6:
        next_token._4_4_ = (int)operation._4_4_ / (int)right_token._4_4_;
        break;
      case 7:
        local_69 = operation._4_4_ != 0 && right_token._4_4_ != 0;
        next_token._4_4_ = (uint)local_69;
        break;
      case 8:
        local_6a = operation._4_4_ != 0 || right_token._4_4_ != 0;
        next_token._4_4_ = (uint)local_6a;
        break;
      case 9:
        next_token._4_4_ = (uint)(operation._4_4_ == right_token._4_4_);
        break;
      case 10:
        next_token._4_4_ = (uint)((int)operation._4_4_ < (int)right_token._4_4_);
        break;
      case 0xb:
        next_token._4_4_ = (uint)((int)right_token._4_4_ < (int)operation._4_4_);
        break;
      case 0xc:
        next_token._4_4_ = (uint)((int)operation._4_4_ <= (int)right_token._4_4_);
        break;
      case 0xd:
        next_token._4_4_ = (uint)((int)right_token._4_4_ <= (int)operation._4_4_);
        break;
      default:
        borg_note("** borg formula failure ** ");
        borg_note("** error calculating a formula value");
      }
      if (*i + 1 < f->count) {
        if (*(int *)((long)f->items[*i + 1] + 0x10) == pdepth) {
          borg_note("** borg formula failure ** ");
          borg_note("** error calculating a formula value");
          f_local._4_4_ = 0;
        }
        else {
          f_local._4_4_ = next_token._4_4_;
        }
      }
      else {
        f_local._4_4_ = next_token._4_4_;
      }
    }
  }
  else {
    f_local._4_4_ = operation._4_4_;
  }
  return f_local._4_4_;
}

Assistant:

static int32_t calculate_value_from_formula_depth(
    struct borg_array *f, int *i, int pdepth, int range_index)
{
    struct token *left_token = (struct token *)f->items[*i];
    int32_t       left_value = 0;

    /* get the value on the left */
    if (left_token->pdepth > pdepth)
        left_value
            = calculate_value_from_formula_depth(f, i, pdepth + 1, range_index);
    else if (left_token->type == TOK_NUMBER) {
        left_value = *((int32_t *)left_token->token);
        if (left_token->not )
            left_value = !left_value;
    } else if (left_token->type == TOK_VALUE) {
        left_value = calculate_from_value(
            (struct value_sec *)left_token->token, range_index);
        if (left_token->not )
            left_value = !left_value;
    }

    if ((*i) + 1 >= f->count)
        return left_value;

    struct token *operation = (struct token *)f->items[(*i) + 1];
    if (operation->pdepth < pdepth)
        return left_value;
    ++(*i);

    /* get the value on the right */
    int32_t       right_value = 0;
    struct token *right_token = (struct token *)f->items[++(*i)];
    if (right_token->pdepth > pdepth)
        right_value
            = calculate_value_from_formula_depth(f, i, pdepth + 1, range_index);
    else if (right_token->type == TOK_NUMBER) {
        right_value = *((int32_t *)right_token->token);
        if (right_token->not )
            right_value = !right_value;
    } else if (right_token->type == TOK_VALUE) {
        right_value = calculate_from_value(
            (struct value_sec *)right_token->token, range_index);
        if (right_token->not )
            right_value = !right_value;
    }

    int32_t total = 0;
    switch (operation->type) {
    case TOK_MINUS:
        total = left_value - right_value;
        break;
    case TOK_PLUS:
        total = left_value + right_value;
        break;
    case TOK_MULT:
        total = left_value * right_value;
        break;
    case TOK_DIV:
        total = left_value / right_value;
        break;
    case TOK_AND:
        total = left_value && right_value;
        break;
    case TOK_OR:
        total = left_value || right_value;
        break;
    case TOK_EQUALS:
        total = left_value == right_value;
        break;
    case TOK_LT:
        total = left_value < right_value;
        break;
    case TOK_GT:
        total = left_value > right_value;
        break;
    case TOK_LE:
        total = left_value <= right_value;
        break;
    case TOK_GE:
        total = left_value >= right_value;
        break;

    default: /* should never get here. */
        borg_note("** borg formula failure ** ");
        borg_note("** error calculating a formula value");
    }
    if ((*i) + 1 >= f->count)
        return total;
    struct token *next_token = (struct token *)f->items[(*i) + 1];
    if (next_token->pdepth != pdepth)
        return total;

    /* we should never get here.  The parsing should handle all validation */
    borg_note("** borg formula failure ** ");
    borg_note("** error calculating a formula value");
    return 0;
}